

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

xmlNodePtr
xmlXIncludeCopyXPointer
          (xmlXIncludeCtxtPtr ctxt,xmlDocPtr target,xmlDocPtr source,xmlXPathObjectPtr obj)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  xmlNodeSetPtr pxVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  xmlNodePtr pxVar11;
  ulong uVar12;
  int iVar13;
  xmlChar *pxVar14;
  uint uVar15;
  _xmlNode *node;
  int iVar16;
  xmlDocPtr source_00;
  long lVar17;
  xmlNodePtr pxVar18;
  int local_74;
  ulong local_70;
  xmlDocPtr local_68;
  int local_5c;
  xmlNodePtr local_58;
  xmlNodePtr local_50;
  int local_44;
  xmlNodePtr local_40;
  xmlNodePtr local_38;
  
  if (source == (xmlDocPtr)0x0) {
    source = ctxt->doc;
  }
  if (obj == (xmlXPathObjectPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (target == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (source == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = obj->type;
  local_68 = target;
  if (xVar1 == XPATH_LOCATIONSET) {
    piVar4 = (int *)obj->user;
    if (piVar4 != (int *)0x0) {
      lVar17 = 0;
      pxVar8 = (xmlNodePtr)0x0;
      pxVar7 = (xmlNodePtr)0x0;
      do {
        if (*piVar4 <= lVar17) {
          return pxVar7;
        }
        pxVar9 = xmlXIncludeCopyXPointer
                           (ctxt,local_68,source,
                            *(xmlXPathObjectPtr *)(*(long *)(piVar4 + 2) + lVar17 * 8));
        if (pxVar8 == (xmlNodePtr)0x0) {
          pxVar7 = pxVar9;
          if (pxVar9 != (xmlNodePtr)0x0) goto LAB_001967aa;
          pxVar9 = (xmlNodePtr)0x0;
          pxVar8 = (xmlNodePtr)0x0;
        }
        else {
          xmlAddNextSibling(pxVar8,pxVar9);
          pxVar9 = pxVar7;
          pxVar7 = pxVar8;
LAB_001967aa:
          do {
            pxVar8 = pxVar7;
            pxVar7 = pxVar8->next;
          } while (pxVar8->next != (_xmlNode *)0x0);
        }
        lVar17 = lVar17 + 1;
        pxVar7 = pxVar9;
      } while( true );
    }
  }
  else if (xVar1 == XPATH_RANGE) {
    local_74 = 0;
    pxVar7 = (xmlNodePtr)obj->user;
    if ((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->type != XML_NAMESPACE_DECL)) {
      local_58 = (xmlNodePtr)obj->user2;
      if (local_58 == (xmlNodePtr)0x0) {
        pxVar7 = xmlDocCopyNode(pxVar7,target,1);
        return pxVar7;
      }
      if (local_58->type != XML_NAMESPACE_DECL) {
        local_70 = (ulong)(uint)obj->index;
        local_5c = obj->index2;
        local_50 = (xmlNodePtr)
                   CONCAT44(local_50._4_4_,(int)CONCAT71((uint7)(uint3)((uint)local_5c >> 8),1));
        node = (_xmlNode *)0x0;
        pxVar8 = (xmlNodePtr)0x0;
        iVar6 = 0;
        local_44 = 0;
        pxVar9 = (xmlNodePtr)0x0;
        pxVar18 = pxVar7;
        local_40 = pxVar7;
LAB_001964b4:
        do {
          while( true ) {
            if (pxVar7 == (xmlNodePtr)0x0) {
              return pxVar8;
            }
            iVar16 = iVar6;
            if (local_74 < 0) {
              for (; local_74 < 0; local_74 = local_74 + 1) {
                pxVar9 = xmlDocCopyNode(node,local_68,2);
                xmlAddChild(pxVar9,pxVar8);
                node = node->parent;
                pxVar8 = pxVar9;
              }
              iVar6 = 0;
              pxVar9 = pxVar8;
              pxVar18 = local_40;
              iVar16 = iVar6;
            }
            for (; iVar5 = local_74, local_74 < iVar6; iVar6 = iVar6 + -1) {
              pxVar9 = pxVar9->parent;
            }
            if (local_74 <= iVar16) {
              iVar16 = local_74;
            }
            iVar13 = (int)local_70;
            iVar6 = iVar16;
            if (pxVar7 != local_58) break;
            if (pxVar7->type == XML_TEXT_NODE) {
              if (pxVar7->content == (xmlChar *)0x0) {
                pxVar14 = (xmlChar *)0x0;
                iVar6 = 0;
              }
              else {
                uVar15 = iVar13 - 1;
                uVar12 = (ulong)uVar15;
                if (local_58 != pxVar18 || iVar13 < 2) {
                  uVar15 = 0;
                  uVar12 = 0;
                }
                pxVar14 = pxVar7->content + uVar12;
                iVar6 = local_5c - uVar15;
              }
              pxVar7 = xmlNewTextLen(pxVar14,iVar6);
              if (pxVar8 == (xmlNodePtr)0x0) {
                return pxVar7;
              }
              if (local_74 == iVar16) {
                xmlAddNextSibling(pxVar9,pxVar7);
                return pxVar8;
              }
              xmlAddChild(pxVar9,pxVar7);
              return pxVar8;
            }
            local_50 = pxVar7;
            pxVar10 = xmlDocCopyNode(pxVar7,local_68,2);
            pxVar7 = local_50;
            if (pxVar8 == (xmlNodePtr)0x0) {
              node = local_50->parent;
              pxVar8 = pxVar10;
            }
            else if (local_74 == iVar16) {
              xmlAddNextSibling(pxVar9,pxVar10);
              pxVar18 = local_40;
            }
            else {
              xmlAddChild(pxVar9,pxVar10);
              pxVar18 = local_40;
              iVar6 = local_74;
            }
            pxVar11 = local_58;
            local_38 = pxVar10;
            if (1 < local_5c) {
              pxVar11 = xmlXIncludeGetNthChild(pxVar7,local_5c + -1);
              local_5c = 0;
            }
            if ((local_58 == pxVar18) && (1 < (int)local_70)) {
              pxVar7 = xmlXIncludeGetNthChild(pxVar7,(int)local_70 + -1);
              local_70 = 0;
            }
            else {
              pxVar7 = pxVar7->children;
            }
            local_74 = local_74 + 1;
            local_50 = (xmlNodePtr)((ulong)local_50 & 0xffffffff00000000);
            pxVar9 = local_38;
            local_58 = pxVar11;
            local_44 = iVar5;
          }
          xVar2 = pxVar7->type;
          if (pxVar7 == pxVar18) {
            if (xVar2 - XML_TEXT_NODE < 2) {
              pxVar14 = pxVar7->content;
              if (pxVar14 == (xmlChar *)0x0) {
                pxVar8 = xmlNewTextLen((xmlChar *)0x0,0);
              }
              else {
                uVar12 = local_70 & 0xffffffff;
                local_70 = local_70 & 0xffffffff;
                if (1 < iVar13) {
                  local_70 = 0;
                  pxVar14 = pxVar14 + (uVar12 - 1);
                }
                pxVar8 = xmlNewText(pxVar14);
              }
              node = pxVar7->parent;
              pxVar9 = pxVar8;
            }
            else {
              pxVar8 = xmlDocCopyNode(pxVar7,local_68,2);
              node = pxVar7->parent;
              pxVar9 = pxVar8;
              if (1 < (int)local_70) {
                pxVar7 = xmlXIncludeGetNthChild(pxVar7,(int)local_70 + -1);
                local_74 = 1;
                local_70 = 0;
                iVar6 = 1;
                goto LAB_001964b4;
              }
            }
          }
          else if (((XML_XINCLUDE_END < xVar2) ||
                   ((0x1bc044U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
                  (pxVar10 = xmlDocCopyNode(pxVar7,local_68,2), pxVar10 != (xmlNodePtr)0x0)) {
            if (local_74 == iVar16) {
              xmlAddNextSibling(pxVar9,pxVar10);
              pxVar9 = pxVar10;
            }
            else {
              xmlAddChild(pxVar9,pxVar10);
              pxVar9 = pxVar10;
              iVar6 = local_74;
            }
          }
          pxVar7 = xmlXPtrAdvanceNode(pxVar7,&local_74);
          if (local_44 <= local_74 && ((ulong)local_50 & 1) == 0) {
            return pxVar8;
          }
        } while( true );
      }
    }
  }
  else if ((xVar1 == XPATH_NODESET) && (pxVar3 = obj->nodesetval, pxVar3 != (xmlNodeSetPtr)0x0)) {
    lVar17 = 0;
    local_58 = (xmlNodePtr)0x0;
    pxVar7 = (xmlNodePtr)0x0;
    do {
      if (pxVar3->nodeNr <= lVar17) {
        return local_58;
      }
      source_00 = (xmlDocPtr)pxVar3->nodeTab[lVar17];
      pxVar8 = pxVar7;
      pxVar9 = local_58;
      if (source_00 != (xmlDocPtr)0x0) {
        xVar2 = source_00->type;
        if (xVar2 < XML_XINCLUDE_END) {
          if ((0x7dc04U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if (xVar2 != XML_XINCLUDE_START) goto LAB_001963fc;
            while (((local_58 = pxVar9, pxVar8 = pxVar7, source_00 = (xmlDocPtr)source_00->next,
                    pxVar9 = local_58, source_00 != (xmlDocPtr)0x0 &&
                    (source_00->type < XML_DOCUMENT_NODE)) &&
                   (obj = (xmlXPathObjectPtr)&DAT_000001fa,
                   (0x1faU >> (source_00->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))
            {
              pxVar7 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_68,source,source_00,
                                           (xmlNodePtr)&DAT_000001fa);
              pxVar9 = pxVar7;
              if (pxVar8 != (xmlNodePtr)0x0) {
                xmlAddNextSibling(pxVar8,pxVar7);
                pxVar9 = local_58;
              }
            }
          }
        }
        else {
LAB_001963fc:
          pxVar8 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_68,source,source_00,(xmlNodePtr)obj
                                      );
          pxVar9 = pxVar8;
          if (pxVar7 != (xmlNodePtr)0x0) {
            xmlAddNextSibling(pxVar7,pxVar8);
            pxVar8 = pxVar7;
            pxVar9 = local_58;
            if (pxVar7->next != (xmlNodePtr)0x0) {
              pxVar8 = pxVar7->next;
            }
          }
        }
      }
      local_58 = pxVar9;
      lVar17 = lVar17 + 1;
      pxVar7 = pxVar8;
    } while( true );
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyXPointer(xmlXIncludeCtxtPtr ctxt, xmlDocPtr target,
	                xmlDocPtr source, xmlXPathObjectPtr obj) {
    xmlNodePtr list = NULL, last = NULL;
    int i;

    if (source == NULL)
	source = ctxt->doc;
    if ((ctxt == NULL) || (target == NULL) || (source == NULL) ||
	(obj == NULL))
	return(NULL);
    switch (obj->type) {
        case XPATH_NODESET: {
	    xmlNodeSetPtr set = obj->nodesetval;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->nodeNr;i++) {
		if (set->nodeTab[i] == NULL)
		    continue;
		switch (set->nodeTab[i]->type) {
		    case XML_TEXT_NODE:
		    case XML_CDATA_SECTION_NODE:
		    case XML_ELEMENT_NODE:
		    case XML_ENTITY_REF_NODE:
		    case XML_ENTITY_NODE:
		    case XML_PI_NODE:
		    case XML_COMMENT_NODE:
		    case XML_DOCUMENT_NODE:
		    case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
		    case XML_DOCB_DOCUMENT_NODE:
#endif
		    case XML_XINCLUDE_END:
			break;
		    case XML_XINCLUDE_START: {
	                xmlNodePtr tmp, cur = set->nodeTab[i];

			cur = cur->next;
			while (cur != NULL) {
			    switch(cur->type) {
				case XML_TEXT_NODE:
				case XML_CDATA_SECTION_NODE:
				case XML_ELEMENT_NODE:
				case XML_ENTITY_REF_NODE:
				case XML_ENTITY_NODE:
				case XML_PI_NODE:
				case XML_COMMENT_NODE:
				    tmp = xmlXIncludeCopyNode(ctxt, target,
							      source, cur);
				    if (last == NULL) {
					list = last = tmp;
				    } else {
					xmlAddNextSibling(last, tmp);
					last = tmp;
				    }
				    cur = cur->next;
				    continue;
				default:
				    break;
			    }
			    break;
			}
			continue;
		    }
		    case XML_ATTRIBUTE_NODE:
		    case XML_NAMESPACE_DECL:
		    case XML_DOCUMENT_TYPE_NODE:
		    case XML_DOCUMENT_FRAG_NODE:
		    case XML_NOTATION_NODE:
		    case XML_DTD_NODE:
		    case XML_ELEMENT_DECL:
		    case XML_ATTRIBUTE_DECL:
		    case XML_ENTITY_DECL:
			continue; /* for */
		}
		if (last == NULL)
		    list = last = xmlXIncludeCopyNode(ctxt, target, source,
			                              set->nodeTab[i]);
		else {
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyNode(ctxt, target, source,
				                set->nodeTab[i]));
		    if (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET: {
	    xmlLocationSetPtr set = (xmlLocationSetPtr) obj->user;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->locNr;i++) {
		if (last == NULL)
		    list = last = xmlXIncludeCopyXPointer(ctxt, target, source,
			                                  set->locTab[i]);
		else
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyXPointer(ctxt, target, source,
				                    set->locTab[i]));
		if (last != NULL) {
		    while (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
	case XPATH_RANGE:
	    return(xmlXIncludeCopyRange(ctxt, target, source, obj));
#endif
	case XPATH_POINT:
	    /* points are ignored in XInclude */
	    break;
	default:
	    break;
    }
    return(list);
}